

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serfloat_tests.cpp
# Opt level: O2

void __thiscall serfloat_tests::double_serfloat_tests::test_method(double_serfloat_tests *this)

{
  uint uVar1;
  double f;
  long lVar2;
  uint uVar3;
  int j;
  int iVar4;
  double dVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  uint64_t *puVar7;
  int x;
  uint uVar8;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  char *local_b48;
  char *local_b40;
  undefined1 *local_b38;
  undefined1 *local_b30;
  char *local_b28;
  char *local_b20;
  char *local_b18;
  char *local_b10;
  undefined1 *local_b08;
  undefined1 *local_b00;
  char *local_af8;
  char *local_af0;
  char *local_ae8;
  char *local_ae0;
  undefined1 *local_ad8;
  undefined1 *local_ad0;
  char *local_ac8;
  char *local_ac0;
  char *local_ab8;
  char *local_ab0;
  undefined1 *local_aa8;
  undefined1 *local_aa0;
  char *local_a98;
  char *local_a90;
  char *local_a88;
  char *local_a80;
  undefined1 *local_a78;
  undefined1 *local_a70;
  char *local_a68;
  char *local_a60;
  char *local_a58;
  char *local_a50;
  undefined1 *local_a48;
  undefined1 *local_a40;
  char *local_a38;
  char *local_a30;
  char *local_a28;
  char *local_a20;
  undefined1 *local_a18;
  undefined1 *local_a10;
  char *local_a08;
  char *local_a00;
  char *local_9f8;
  char *local_9f0;
  undefined1 *local_9e8;
  undefined1 *local_9e0;
  char *local_9d8;
  char *local_9d0;
  char *local_9c8;
  char *local_9c0;
  undefined1 *local_9b8;
  undefined1 *local_9b0;
  char *local_9a8;
  char *local_9a0;
  char *local_998;
  char *local_990;
  undefined1 *local_988;
  undefined1 *local_980;
  char *local_978;
  char *local_970;
  char *local_968;
  char *local_960;
  undefined1 *local_958;
  undefined1 *local_950;
  char *local_948;
  char *local_940;
  char *local_938;
  char *local_930;
  undefined1 *local_928;
  undefined1 *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  char *local_900;
  undefined1 *local_8f8;
  undefined1 *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8d0;
  undefined1 *local_8c8;
  undefined1 *local_8c0;
  char *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  undefined1 *local_898;
  undefined1 *local_890;
  char *local_888;
  char *local_880;
  char *local_878;
  char *local_870;
  undefined1 *local_868;
  undefined1 *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  undefined1 *local_838;
  undefined1 *local_830;
  char *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  undefined1 *local_808;
  undefined1 *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  undefined1 *local_7d8;
  undefined1 *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  undefined1 *local_7a8;
  undefined1 *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  undefined1 *local_748;
  undefined1 *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  undefined1 *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  undefined1 *local_688;
  undefined1 *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  undefined8 local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  uint64_t local_90;
  char *local_88;
  char *local_80;
  undefined **local_78;
  undefined1 local_70;
  undefined1 *local_68;
  char *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_40 = "";
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x29;
  file.m_begin = (iterator)&local_48;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_58,msg);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_80 = "";
  local_90 = anon_unknown_4::TestDouble(0.0);
  puVar7 = &local_90;
  local_c8 = (ulong)local_c8._4_4_ << 0x20;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_78,&local_88,0x29,1,2,puVar7,"TestDouble(0.0)",&local_c8,"0U");
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x2a;
  file_00.m_begin = (iterator)&local_a0;
  msg_00.m_end = (iterator)puVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_b0,msg_00
            );
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_b8 = "";
  local_90 = anon_unknown_4::TestDouble(-0.0);
  puVar7 = &local_90;
  local_c8 = 0x8000000000000000;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_c0,0x2a,1,2,puVar7,"TestDouble(-0.0)",&local_c8,"0x8000000000000000");
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x2b;
  file_01.m_begin = (iterator)&local_d8;
  msg_01.m_end = (iterator)puVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_e8,msg_01
            );
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_f0 = "";
  local_90 = anon_unknown_4::TestDouble(INFINITY);
  puVar7 = &local_90;
  local_c8 = 0x7ff0000000000000;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_f8,0x2b,1,2,puVar7,
             "TestDouble(std::numeric_limits<double>::infinity())",&local_c8,"0x7ff0000000000000U");
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x2c;
  file_02.m_begin = (iterator)&local_108;
  msg_02.m_end = (iterator)puVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_118,
             msg_02);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_120 = "";
  local_90 = anon_unknown_4::TestDouble(-INFINITY);
  puVar7 = &local_90;
  local_c8 = 0xfff0000000000000;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_128,0x2c,1,2,puVar7,
             "TestDouble(-std::numeric_limits<double>::infinity())",&local_c8,"0xfff0000000000000");
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x2d;
  file_03.m_begin = (iterator)&local_138;
  msg_03.m_end = (iterator)puVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_148,
             msg_03);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_150 = "";
  local_90 = anon_unknown_4::TestDouble(0.5);
  puVar7 = &local_90;
  local_c8 = 0x3fe0000000000000;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (&local_78,&local_158,0x2d,1,2,puVar7,"TestDouble(0.5)",&local_c8,
             "0x3fe0000000000000ULL");
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x2e;
  file_04.m_begin = (iterator)&local_168;
  msg_04.m_end = (iterator)puVar7;
  msg_04.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_178,
             msg_04);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_180 = "";
  local_90 = anon_unknown_4::TestDouble(1.0);
  puVar7 = &local_90;
  local_c8 = 0x3ff0000000000000;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (&local_78,&local_188,0x2e,1,2,puVar7,"TestDouble(1.0)",&local_c8,
             "0x3ff0000000000000ULL");
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x2f;
  file_05.m_begin = (iterator)&local_198;
  msg_05.m_end = (iterator)puVar7;
  msg_05.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1a8,
             msg_05);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_1b0 = "";
  local_90 = anon_unknown_4::TestDouble(2.0);
  puVar7 = &local_90;
  local_c8 = 0x4000000000000000;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (&local_78,&local_1b8,0x2f,1,2,puVar7,"TestDouble(2.0)",&local_c8,
             "0x4000000000000000ULL");
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x30;
  file_06.m_begin = (iterator)&local_1c8;
  msg_06.m_end = (iterator)puVar7;
  msg_06.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_1d8,
             msg_06);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_1e0 = "";
  local_90 = anon_unknown_4::TestDouble(4.0);
  puVar7 = &local_90;
  local_c8 = 0x4010000000000000;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (&local_78,&local_1e8,0x30,1,2,puVar7,"TestDouble(4.0)",&local_c8,
             "0x4010000000000000ULL");
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x31;
  file_07.m_begin = (iterator)&local_1f8;
  msg_07.m_end = (iterator)puVar7;
  msg_07.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_208,
             msg_07);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_210 = "";
  local_90 = anon_unknown_4::TestDouble(785.066650390625);
  puVar7 = &local_90;
  local_c8 = 0x4088888880000000;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (&local_78,&local_218,0x31,1,2,puVar7,"TestDouble(785.066650390625)",&local_c8,
             "0x4088888880000000ULL");
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = &DAT_00000032;
  file_08.m_begin = (iterator)&local_228;
  msg_08.m_end = (iterator)puVar7;
  msg_08.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_238,
             msg_08);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_240 = "";
  local_90 = anon_unknown_4::TestDouble(3.7243058682384174);
  puVar7 = &local_90;
  local_c8 = 0x400dcb60e0031440;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_248,0x32,1,2,puVar7,"TestDouble(3.7243058682384174)",&local_c8,
             "0x400dcb60e0031440");
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x33;
  file_09.m_begin = (iterator)&local_258;
  msg_09.m_end = (iterator)puVar7;
  msg_09.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_268,
             msg_09);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_270 = "";
  local_90 = anon_unknown_4::TestDouble(91.64070592566159);
  puVar7 = &local_90;
  local_c8 = 0x4056e901536d447a;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_278,0x33,1,2,puVar7,"TestDouble(91.64070592566159)",&local_c8,
             "0x4056e901536d447a");
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x34;
  file_10.m_begin = (iterator)&local_288;
  msg_10.m_end = (iterator)puVar7;
  msg_10.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_298,
             msg_10);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_2a0 = "";
  local_90 = anon_unknown_4::TestDouble(-98.63087668642575);
  puVar7 = &local_90;
  local_c8 = 0xc058a860489c007a;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_2a8,0x34,1,2,puVar7,"TestDouble(-98.63087668642575)",&local_c8,
             "0xc058a860489c007a");
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x35;
  file_11.m_begin = (iterator)&local_2b8;
  msg_11.m_end = (iterator)puVar7;
  msg_11.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_2c8,
             msg_11);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_2d0 = "";
  local_90 = anon_unknown_4::TestDouble(4.908737756962054);
  puVar7 = &local_90;
  local_c8 = 0x4013a28c268b2b70;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_2d8,0x35,1,2,puVar7,"TestDouble(4.908737756962054)",&local_c8,
             "0x4013a28c268b2b70");
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x36;
  file_12.m_begin = (iterator)&local_2e8;
  msg_12.m_end = (iterator)puVar7;
  msg_12.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_2f8,
             msg_12);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_300 = "";
  local_90 = anon_unknown_4::TestDouble(77.9247330021754);
  puVar7 = &local_90;
  local_c8 = 0x40537b2ed3547804;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_308,0x36,1,2,puVar7,"TestDouble(77.9247330021754)",&local_c8,
             "0x40537b2ed3547804");
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x37;
  file_13.m_begin = (iterator)&local_318;
  msg_13.m_end = (iterator)puVar7;
  msg_13.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_328,
             msg_13);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_330 = "";
  local_90 = anon_unknown_4::TestDouble(40.24732825357566);
  puVar7 = &local_90;
  local_c8 = 0x40441fa873c43dfc;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_338,0x37,1,2,puVar7,"TestDouble(40.24732825357566)",&local_c8,
             "0x40441fa873c43dfc");
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x38;
  file_14.m_begin = (iterator)&local_348;
  msg_14.m_end = (iterator)puVar7;
  msg_14.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_358,
             msg_14);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_360 = "";
  local_90 = anon_unknown_4::TestDouble(71.39395607929222);
  puVar7 = &local_90;
  local_c8 = 0x4051d936938f27b6;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_368,0x38,1,2,puVar7,"TestDouble(71.39395607929222)",&local_c8,
             "0x4051d936938f27b6");
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x39;
  file_15.m_begin = (iterator)&local_378;
  msg_15.m_end = (iterator)puVar7;
  msg_15.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_388,
             msg_15);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_390 = "";
  local_90 = anon_unknown_4::TestDouble(58.80100710817612);
  puVar7 = &local_90;
  local_c8 = 0x404d668766a2bd70;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_398,0x39,1,2,puVar7,"TestDouble(58.80100710817612)",&local_c8,
             "0x404d668766a2bd70");
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x3a;
  file_16.m_begin = (iterator)&local_3a8;
  msg_16.m_end = (iterator)puVar7;
  msg_16.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_3b8,
             msg_16);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_3c0 = "";
  local_90 = anon_unknown_4::TestDouble(-30.10665786964975);
  puVar7 = &local_90;
  local_c8 = 0xc03e1b4dee1e01b8;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_3c8,0x3a,1,2,puVar7,"TestDouble(-30.10665786964975)",&local_c8,
             "0xc03e1b4dee1e01b8");
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x3b;
  file_17.m_begin = (iterator)&local_3d8;
  msg_17.m_end = (iterator)puVar7;
  msg_17.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_3e8,
             msg_17);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_3f0 = "";
  local_90 = anon_unknown_4::TestDouble(60.15231509068704);
  puVar7 = &local_90;
  local_c8 = 0x404e137f0f969814;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_3f8,0x3b,1,2,puVar7,"TestDouble(60.15231509068704)",&local_c8,
             "0x404e137f0f969814");
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x3c;
  file_18.m_begin = (iterator)&local_408;
  msg_18.m_end = (iterator)puVar7;
  msg_18.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_418,
             msg_18);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_420 = "";
  local_90 = anon_unknown_4::TestDouble(-48.15848711335961);
  puVar7 = &local_90;
  local_c8 = 0xc04814494e445bc6;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_428,0x3c,1,2,puVar7,"TestDouble(-48.15848711335961)",&local_c8,
             "0xc04814494e445bc6");
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x3d;
  file_19.m_begin = (iterator)&local_438;
  msg_19.m_end = (iterator)puVar7;
  msg_19.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_448,
             msg_19);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_450 = "";
  local_90 = anon_unknown_4::TestDouble(26.68450101125353);
  puVar7 = &local_90;
  local_c8 = 0x403aaf3b755169b0;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_458,0x3d,1,2,puVar7,"TestDouble(26.68450101125353)",&local_c8,
             "0x403aaf3b755169b0");
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x3e;
  file_20.m_begin = (iterator)&local_468;
  msg_20.m_end = (iterator)puVar7;
  msg_20.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_478,
             msg_20);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_480 = "";
  local_90 = anon_unknown_4::TestDouble(-65.72071986604303);
  puVar7 = &local_90;
  local_c8 = 0xc0506e2046378ede;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_488,0x3e,1,2,puVar7,"TestDouble(-65.72071986604303)",&local_c8,
             "0xc0506e2046378ede");
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x3f;
  file_21.m_begin = (iterator)&local_498;
  msg_21.m_end = (iterator)puVar7;
  msg_21.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_4a8,
             msg_21);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_4b0 = "";
  local_90 = anon_unknown_4::TestDouble(17.95575825512381);
  puVar7 = &local_90;
  local_c8 = 0x4031f4ac92b0a388;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_4b8,0x3f,1,2,puVar7,"TestDouble(17.95575825512381)",&local_c8,
             "0x4031f4ac92b0a388");
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x40;
  file_22.m_begin = (iterator)&local_4c8;
  msg_22.m_end = (iterator)puVar7;
  msg_22.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_4d8,
             msg_22);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_4e0 = "";
  local_90 = anon_unknown_4::TestDouble(-35.27171863226279);
  puVar7 = &local_90;
  local_c8 = 0xc041a2c7ad17a42a;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_4e8,0x40,1,2,puVar7,"TestDouble(-35.27171863226279)",&local_c8,
             "0xc041a2c7ad17a42a");
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x41;
  file_23.m_begin = (iterator)&local_4f8;
  msg_23.m_end = (iterator)puVar7;
  msg_23.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_508,
             msg_23);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_518 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_510 = "";
  local_90 = anon_unknown_4::TestDouble(-8.58810329425124);
  puVar7 = &local_90;
  local_c8 = 0xc0212d1bdffef538;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_518,0x41,1,2,puVar7,"TestDouble(-8.58810329425124)",&local_c8,
             "0xc0212d1bdffef538");
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x42;
  file_24.m_begin = (iterator)&local_528;
  msg_24.m_end = (iterator)puVar7;
  msg_24.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_538,
             msg_24);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_540 = "";
  local_90 = anon_unknown_4::TestDouble(88.51393044338977);
  puVar7 = &local_90;
  local_c8 = 0x405620e43c83b1c8;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_548,0x42,1,2,puVar7,"TestDouble(88.51393044338977)",&local_c8,
             "0x405620e43c83b1c8");
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x43;
  file_25.m_begin = (iterator)&local_558;
  msg_25.m_end = (iterator)puVar7;
  msg_25.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_568,
             msg_25);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_578 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_570 = "";
  local_90 = anon_unknown_4::TestDouble(48.07224932612732);
  puVar7 = &local_90;
  local_c8 = 0x4048093f77466ffc;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_578,0x43,1,2,puVar7,"TestDouble(48.07224932612732)",&local_c8,
             "0x4048093f77466ffc");
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x44;
  file_26.m_begin = (iterator)&local_588;
  msg_26.m_end = (iterator)puVar7;
  msg_26.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_598,
             msg_26);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_5a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_5a0 = "";
  local_90 = anon_unknown_4::TestDouble(9.867348871395659e+117);
  puVar7 = &local_90;
  local_c8 = 0x586f4daeb2459b9f;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_5a8,0x44,1,2,puVar7,"TestDouble(9.867348871395659e+117)",&local_c8,
             "0x586f4daeb2459b9f");
  local_5b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_5b0 = "";
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x45;
  file_27.m_begin = (iterator)&local_5b8;
  msg_27.m_end = (iterator)puVar7;
  msg_27.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_5c8,
             msg_27);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_5d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_5d0 = "";
  local_90 = anon_unknown_4::TestDouble(-1.5166424385129721e+206);
  puVar7 = &local_90;
  local_c8 = 0xeabe3bbc484bd458;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_5d8,0x45,1,2,puVar7,"TestDouble(-1.5166424385129721e+206)",&local_c8,
             "0xeabe3bbc484bd458");
  local_5e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x46;
  file_28.m_begin = (iterator)&local_5e8;
  msg_28.m_end = (iterator)puVar7;
  msg_28.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_5f8,
             msg_28);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_608 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_600 = "";
  local_90 = anon_unknown_4::TestDouble(-8.585156555624594e-275);
  puVar7 = &local_90;
  local_c8 = 0x8707c76eee012429;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_608,0x46,1,2,puVar7,"TestDouble(-8.585156555624594e-275)",&local_c8,
             "0x8707c76eee012429");
  local_618 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_610 = "";
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x47;
  file_29.m_begin = (iterator)&local_618;
  msg_29.m_end = (iterator)puVar7;
  msg_29.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_628,
             msg_29);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_630 = "";
  local_90 = anon_unknown_4::TestDouble(2.2794371091628822e+113);
  puVar7 = &local_90;
  local_c8 = 0x5777b2184458f4ee;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_638,0x47,1,2,puVar7,"TestDouble(2.2794371091628822e+113)",&local_c8,
             "0x5777b2184458f4ee");
  local_648 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_640 = "";
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x48;
  file_30.m_begin = (iterator)&local_648;
  msg_30.m_end = (iterator)puVar7;
  msg_30.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_658,
             msg_30);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_668 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_660 = "";
  local_90 = anon_unknown_4::TestDouble(-1.1290476594131867e+163);
  puVar7 = &local_90;
  local_c8 = 0xe1c91893d3488bb0;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_668,0x48,1,2,puVar7,"TestDouble(-1.1290476594131867e+163)",&local_c8,
             "0xe1c91893d3488bb0");
  local_678 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_670 = "";
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x49;
  file_31.m_begin = (iterator)&local_678;
  msg_31.m_end = (iterator)puVar7;
  msg_31.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_688,
             msg_31);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_698 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_690 = "";
  local_90 = anon_unknown_4::TestDouble(9.143848423979275e-246);
  puVar7 = &local_90;
  local_c8 = 0xd0ff76e5f2620a3;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_698,0x49,1,2,puVar7,"TestDouble(9.143848423979275e-246)",&local_c8,
             "0x0d0ff76e5f2620a3");
  local_6a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_6a0 = "";
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x4a;
  file_32.m_begin = (iterator)&local_6a8;
  msg_32.m_end = (iterator)puVar7;
  msg_32.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_6b8,
             msg_32);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_6c0 = "";
  local_90 = anon_unknown_4::TestDouble(-2.8366718125941117e+81);
  puVar7 = &local_90;
  local_c8 = 0xd0d7ec7e754b394a;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_6c8,0x4a,1,2,puVar7,"TestDouble(-2.8366718125941117e+81)",&local_c8,
             "0xd0d7ec7e754b394a");
  local_6d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_6d0 = "";
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x4b;
  file_33.m_begin = (iterator)&local_6d8;
  msg_33.m_end = (iterator)puVar7;
  msg_33.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_6e8,
             msg_33);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_6f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_6f0 = "";
  local_90 = anon_unknown_4::TestDouble(-1.2754409481684012e+229);
  puVar7 = &local_90;
  local_c8 = 0xef80d32f8ec55342;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_6f8,0x4b,1,2,puVar7,"TestDouble(-1.2754409481684012e+229)",&local_c8,
             "0xef80d32f8ec55342");
  local_708 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_700 = "";
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x4c;
  file_34.m_begin = (iterator)&local_708;
  msg_34.m_end = (iterator)puVar7;
  msg_34.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_718,
             msg_34);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_728 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_720 = "";
  local_90 = anon_unknown_4::TestDouble(6.000577060053642e-186);
  puVar7 = &local_90;
  local_c8 = 0x197a1be7c8209b6a;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_728,0x4c,1,2,puVar7,"TestDouble(6.000577060053642e-186)",&local_c8,
             "0x197a1be7c8209b6a");
  local_738 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_730 = "";
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x4d;
  file_35.m_begin = (iterator)&local_738;
  msg_35.m_end = (iterator)puVar7;
  msg_35.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_748,
             msg_35);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_750 = "";
  local_90 = anon_unknown_4::TestDouble(2.0839423284378986e-302);
  puVar7 = &local_90;
  local_c8 = 0x14c94f8689cb0a5;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_758,0x4d,1,2,puVar7,"TestDouble(2.0839423284378986e-302)",&local_c8,
             "0x014c94f8689cb0a5");
  local_768 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_760 = "";
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0x4e;
  file_36.m_begin = (iterator)&local_768;
  msg_36.m_end = (iterator)puVar7;
  msg_36.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_778,
             msg_36);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_788 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_780 = "";
  local_90 = anon_unknown_4::TestDouble(-1.422140051483753e+259);
  puVar7 = &local_90;
  local_c8 = 0xf5bd99271d04bb35;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_788,0x4e,1,2,puVar7,"TestDouble(-1.422140051483753e+259)",&local_c8,
             "0xf5bd99271d04bb35");
  local_798 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_790 = "";
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0x4f;
  file_37.m_begin = (iterator)&local_798;
  msg_37.m_end = (iterator)puVar7;
  msg_37.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_7a8,
             msg_37);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_7b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_7b0 = "";
  local_90 = anon_unknown_4::TestDouble(-1.0593973991188853e+46);
  puVar7 = &local_90;
  local_c8 = 0xc97db0cdb72d1046;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_7b8,0x4f,1,2,puVar7,"TestDouble(-1.0593973991188853e+46)",&local_c8,
             "0xc97db0cdb72d1046");
  local_7c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_7c0 = "";
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = &DAT_00000050;
  file_38.m_begin = (iterator)&local_7c8;
  msg_38.m_end = (iterator)puVar7;
  msg_38.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_7d8,
             msg_38);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_7e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_7e0 = "";
  local_90 = anon_unknown_4::TestDouble(2.62945125875249e+190);
  puVar7 = &local_90;
  local_c8 = 0x67779b36366c993b;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_7e8,0x50,1,2,puVar7,"TestDouble(2.62945125875249e+190)",&local_c8,
             "0x67779b36366c993b");
  local_7f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_7f0 = "";
  local_808 = &boost::unit_test::basic_cstring<char_const>::null;
  local_800 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0x51;
  file_39.m_begin = (iterator)&local_7f8;
  msg_39.m_end = (iterator)puVar7;
  msg_39.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_808,
             msg_39);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_818 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_810 = "";
  local_90 = anon_unknown_4::TestDouble(-2.920377657275094e+115);
  puVar7 = &local_90;
  local_c8 = 0xd7e7b7b45908e23b;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_818,0x51,1,2,puVar7,"TestDouble(-2.920377657275094e+115)",&local_c8,
             "0xd7e7b7b45908e23b");
  local_828 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_820 = "";
  local_838 = &boost::unit_test::basic_cstring<char_const>::null;
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0x52;
  file_40.m_begin = (iterator)&local_828;
  msg_40.m_end = (iterator)puVar7;
  msg_40.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_838,
             msg_40);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_848 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_840 = "";
  local_90 = anon_unknown_4::TestDouble(9.790289014855851e-118);
  puVar7 = &local_90;
  local_c8 = 0x27a3c031cc428bcc;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_848,0x52,1,2,puVar7,"TestDouble(9.790289014855851e-118)",&local_c8,
             "0x27a3c031cc428bcc");
  local_858 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_850 = "";
  local_868 = &boost::unit_test::basic_cstring<char_const>::null;
  local_860 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0x53;
  file_41.m_begin = (iterator)&local_858;
  msg_41.m_end = (iterator)puVar7;
  msg_41.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_868,
             msg_41);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_878 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_870 = "";
  local_90 = anon_unknown_4::TestDouble(-4.629317182034961e-114);
  puVar7 = &local_90;
  local_c8 = 0xa866ccf0b753705a;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_878,0x53,1,2,puVar7,"TestDouble(-4.629317182034961e-114)",&local_c8,
             "0xa866ccf0b753705a");
  local_888 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_880 = "";
  local_898 = &boost::unit_test::basic_cstring<char_const>::null;
  local_890 = &boost::unit_test::basic_cstring<char_const>::null;
  file_42.m_end = (iterator)0x54;
  file_42.m_begin = (iterator)&local_888;
  msg_42.m_end = (iterator)puVar7;
  msg_42.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_898,
             msg_42);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_8a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_8a0 = "";
  local_90 = anon_unknown_4::TestDouble(-1.7674605603846528e+279);
  puVar7 = &local_90;
  local_c8 = 0xf9e8ed383ffc3e25;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_8a8,0x54,1,2,puVar7,"TestDouble(-1.7674605603846528e+279)",&local_c8,
             "0xf9e8ed383ffc3e25");
  local_8b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_8b0 = "";
  local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_43.m_end = (iterator)0x55;
  file_43.m_begin = (iterator)&local_8b8;
  msg_43.m_end = (iterator)puVar7;
  msg_43.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_8c8,
             msg_43);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_8d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_8d0 = "";
  local_90 = anon_unknown_4::TestDouble(2.5308171727712605e+120);
  puVar7 = &local_90;
  local_c8 = 0x58ef5cd55f0ec997;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_8d8,0x55,1,2,puVar7,"TestDouble(2.5308171727712605e+120)",&local_c8,
             "0x58ef5cd55f0ec997");
  local_8e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_8e0 = "";
  local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_44.m_end = (iterator)0x56;
  file_44.m_begin = (iterator)&local_8e8;
  msg_44.m_end = (iterator)puVar7;
  msg_44.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_8f8,
             msg_44);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_908 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_900 = "";
  local_90 = anon_unknown_4::TestDouble(-1.05034156412799e+54);
  puVar7 = &local_90;
  local_c8 = 0xcb25eea1b9350fa0;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_908,0x56,1,2,puVar7,"TestDouble(-1.05034156412799e+54)",&local_c8,
             "0xcb25eea1b9350fa0");
  local_918 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_910 = "";
  local_928 = &boost::unit_test::basic_cstring<char_const>::null;
  local_920 = &boost::unit_test::basic_cstring<char_const>::null;
  file_45.m_end = (iterator)0x59;
  file_45.m_begin = (iterator)&local_918;
  msg_45.m_end = (iterator)puVar7;
  msg_45.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_928,
             msg_45);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_938 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_930 = "";
  local_90 = anon_unknown_4::TestDouble(2.2250738585072014e-308);
  puVar7 = &local_90;
  local_c8 = 0x10000000000000;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_938,0x59,1,2,puVar7,"TestDouble(std::numeric_limits<double>::min())",
             &local_c8,"0x10000000000000");
  local_948 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_940 = "";
  local_958 = &boost::unit_test::basic_cstring<char_const>::null;
  local_950 = &boost::unit_test::basic_cstring<char_const>::null;
  file_46.m_end = (iterator)0x5a;
  file_46.m_begin = (iterator)&local_948;
  msg_46.m_end = (iterator)puVar7;
  msg_46.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_958,
             msg_46);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_968 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_960 = "";
  local_90 = anon_unknown_4::TestDouble(-2.2250738585072014e-308);
  puVar7 = &local_90;
  local_c8 = 0x8010000000000000;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_968,0x5a,1,2,puVar7,"TestDouble(-std::numeric_limits<double>::min())",
             &local_c8,"0x8010000000000000");
  local_978 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_970 = "";
  local_988 = &boost::unit_test::basic_cstring<char_const>::null;
  local_980 = &boost::unit_test::basic_cstring<char_const>::null;
  file_47.m_end = (iterator)0x5b;
  file_47.m_begin = (iterator)&local_978;
  msg_47.m_end = (iterator)puVar7;
  msg_47.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_988,
             msg_47);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_998 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_990 = "";
  local_90 = anon_unknown_4::TestDouble(1.79769313486232e+308);
  puVar7 = &local_90;
  local_c8 = 0x7fefffffffffffff;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_998,0x5b,1,2,puVar7,"TestDouble(std::numeric_limits<double>::max())",
             &local_c8,"0x7fefffffffffffff");
  local_9a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_9a0 = "";
  local_9b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_48.m_end = (iterator)0x5c;
  file_48.m_begin = (iterator)&local_9a8;
  msg_48.m_end = (iterator)puVar7;
  msg_48.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,(size_t)&local_9b8,
             msg_48);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_9c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_9c0 = "";
  local_90 = anon_unknown_4::TestDouble(-1.79769313486232e+308);
  puVar7 = &local_90;
  local_c8 = 0xffefffffffffffff;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_9c8,0x5c,1,2,puVar7,"TestDouble(-std::numeric_limits<double>::max())",
             &local_c8,"0xffefffffffffffff");
  local_9d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_9d0 = "";
  local_9e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_49.m_end = (iterator)0x5d;
  file_49.m_begin = (iterator)&local_9d8;
  msg_49.m_end = (iterator)puVar7;
  msg_49.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,(size_t)&local_9e8,
             msg_49);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_9f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_9f0 = "";
  local_90 = anon_unknown_4::TestDouble(-1.79769313486232e+308);
  puVar7 = &local_90;
  local_c8 = 0xffefffffffffffff;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_9f8,0x5d,1,2,puVar7,
             "TestDouble(std::numeric_limits<double>::lowest())",&local_c8,"0xffefffffffffffff");
  local_a08 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_a00 = "";
  local_a18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a10 = &boost::unit_test::basic_cstring<char_const>::null;
  file_50.m_end = (iterator)0x5e;
  file_50.m_begin = (iterator)&local_a08;
  msg_50.m_end = (iterator)puVar7;
  msg_50.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,(size_t)&local_a18,
             msg_50);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_a28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_a20 = "";
  local_90 = anon_unknown_4::TestDouble(1.79769313486232e+308);
  puVar7 = &local_90;
  local_c8 = 0x7fefffffffffffff;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_a28,0x5e,1,2,puVar7,
             "TestDouble(-std::numeric_limits<double>::lowest())",&local_c8,"0x7fefffffffffffff");
  local_a38 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_a30 = "";
  local_a48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a40 = &boost::unit_test::basic_cstring<char_const>::null;
  file_51.m_end = (iterator)0x5f;
  file_51.m_begin = (iterator)&local_a38;
  msg_51.m_end = (iterator)puVar7;
  msg_51.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,(size_t)&local_a48,
             msg_51);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_a58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_a50 = "";
  local_90 = anon_unknown_4::TestDouble(4.94065645841247e-324);
  puVar7 = &local_90;
  local_c8 = CONCAT44(local_c8._4_4_,1);
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&local_78,&local_a58,0x5f,1,2,puVar7,
             "TestDouble(std::numeric_limits<double>::denorm_min())",&local_c8,"0x1");
  local_a68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_a60 = "";
  local_a78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a70 = &boost::unit_test::basic_cstring<char_const>::null;
  file_52.m_end = (iterator)0x60;
  file_52.m_begin = (iterator)&local_a68;
  msg_52.m_end = (iterator)puVar7;
  msg_52.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,(size_t)&local_a78,
             msg_52);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_a88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_a80 = "";
  local_90 = anon_unknown_4::TestDouble(-4.94065645841247e-324);
  puVar7 = &local_90;
  local_c8 = 0x8000000000000001;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_78,&local_a88,0x60,1,2,puVar7,
             "TestDouble(-std::numeric_limits<double>::denorm_min())",&local_c8,"0x8000000000000001"
            );
  local_a98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_a90 = "";
  local_aa8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_aa0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_53.m_end = (iterator)0x62;
  file_53.m_begin = (iterator)&local_a98;
  msg_53.m_end = (iterator)puVar7;
  msg_53.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,(size_t)&local_aa8,
             msg_53);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_ab8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_ab0 = "";
  local_90 = anon_unknown_4::TestDouble(NAN);
  puVar7 = &local_90;
  local_c8 = 0x7ff8000000000000;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_ab8,0x62,1,2,puVar7,
             "TestDouble(std::numeric_limits<double>::quiet_NaN())",&local_c8,"0x7ff8000000000000");
  local_ac8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_ac0 = "";
  local_ad8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ad0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_54.m_end = (iterator)0x63;
  file_54.m_begin = (iterator)&local_ac8;
  msg_54.m_end = (iterator)puVar7;
  msg_54.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,(size_t)&local_ad8,
             msg_54);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_ae8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_ae0 = "";
  local_90 = anon_unknown_4::TestDouble(-NAN);
  puVar7 = &local_90;
  local_c8 = 0x7ff8000000000000;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_ae8,99,1,2,puVar7,
             "TestDouble(-std::numeric_limits<double>::quiet_NaN())",&local_c8,"0x7ff8000000000000")
  ;
  local_af8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_af0 = "";
  local_b08 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b00 = &boost::unit_test::basic_cstring<char_const>::null;
  file_55.m_end = (iterator)0x64;
  file_55.m_begin = (iterator)&local_af8;
  msg_55.m_end = (iterator)puVar7;
  msg_55.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,(size_t)&local_b08,
             msg_55);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_b18 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_b10 = "";
  local_90 = anon_unknown_4::TestDouble(NAN);
  puVar7 = &local_90;
  local_c8 = 0x7ff8000000000000;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_b18,100,1,2,puVar7,
             "TestDouble(std::numeric_limits<double>::signaling_NaN())",&local_c8,
             "0x7ff8000000000000");
  local_b28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_b20 = "";
  local_b38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b30 = &boost::unit_test::basic_cstring<char_const>::null;
  file_56.m_end = (iterator)0x65;
  file_56.m_begin = (iterator)&local_b28;
  msg_56.m_end = (iterator)puVar7;
  msg_56.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,(size_t)&local_b38,
             msg_56);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_011480b0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_b48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_b40 = "";
  local_90 = anon_unknown_4::TestDouble(-NAN);
  local_c8 = 0x7ff8000000000000;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
            (&local_78,&local_b48,0x65,1,2,&local_90,
             "TestDouble(-std::numeric_limits<double>::signaling_NaN())",&local_c8,
             "0x7ff8000000000000");
  for (iVar4 = 0; iVar4 != 1000; iVar4 = iVar4 + 1) {
    for (uVar8 = 0; uVar8 != 0x200; uVar8 = uVar8 + 1) {
      f = (double)FastRandomContext::rand64(&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng);
      uVar3 = 0;
      for (lVar2 = 0; lVar2 != 0x24; lVar2 = lVar2 + 4) {
        dVar5 = (double)((ulong)f & ~(1L << ((ulong)(byte)(&DAT_00c1b794)[lVar2] & 0x3f)));
        uVar1 = uVar3 & 0x1f;
        uVar3 = uVar3 + 1;
        f = (double)((ulong)f | 1L << ((ulong)(byte)(&DAT_00c1b794)[lVar2] & 0x3f));
        if ((uVar8 >> uVar1 & 1) == 0) {
          f = dVar5;
        }
      }
      anon_unknown_4::TestDouble(f);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(double_serfloat_tests) {
    // Test specific values against their expected encoding.
    BOOST_CHECK_EQUAL(TestDouble(0.0), 0U);
    BOOST_CHECK_EQUAL(TestDouble(-0.0), 0x8000000000000000);
    BOOST_CHECK_EQUAL(TestDouble(std::numeric_limits<double>::infinity()), 0x7ff0000000000000U);
    BOOST_CHECK_EQUAL(TestDouble(-std::numeric_limits<double>::infinity()), 0xfff0000000000000);
    BOOST_CHECK_EQUAL(TestDouble(0.5), 0x3fe0000000000000ULL);
    BOOST_CHECK_EQUAL(TestDouble(1.0), 0x3ff0000000000000ULL);
    BOOST_CHECK_EQUAL(TestDouble(2.0), 0x4000000000000000ULL);
    BOOST_CHECK_EQUAL(TestDouble(4.0), 0x4010000000000000ULL);
    BOOST_CHECK_EQUAL(TestDouble(785.066650390625), 0x4088888880000000ULL);
    BOOST_CHECK_EQUAL(TestDouble(3.7243058682384174), 0x400dcb60e0031440);
    BOOST_CHECK_EQUAL(TestDouble(91.64070592566159), 0x4056e901536d447a);
    BOOST_CHECK_EQUAL(TestDouble(-98.63087668642575), 0xc058a860489c007a);
    BOOST_CHECK_EQUAL(TestDouble(4.908737756962054), 0x4013a28c268b2b70);
    BOOST_CHECK_EQUAL(TestDouble(77.9247330021754), 0x40537b2ed3547804);
    BOOST_CHECK_EQUAL(TestDouble(40.24732825357566), 0x40441fa873c43dfc);
    BOOST_CHECK_EQUAL(TestDouble(71.39395607929222), 0x4051d936938f27b6);
    BOOST_CHECK_EQUAL(TestDouble(58.80100710817612), 0x404d668766a2bd70);
    BOOST_CHECK_EQUAL(TestDouble(-30.10665786964975), 0xc03e1b4dee1e01b8);
    BOOST_CHECK_EQUAL(TestDouble(60.15231509068704), 0x404e137f0f969814);
    BOOST_CHECK_EQUAL(TestDouble(-48.15848711335961), 0xc04814494e445bc6);
    BOOST_CHECK_EQUAL(TestDouble(26.68450101125353), 0x403aaf3b755169b0);
    BOOST_CHECK_EQUAL(TestDouble(-65.72071986604303), 0xc0506e2046378ede);
    BOOST_CHECK_EQUAL(TestDouble(17.95575825512381), 0x4031f4ac92b0a388);
    BOOST_CHECK_EQUAL(TestDouble(-35.27171863226279), 0xc041a2c7ad17a42a);
    BOOST_CHECK_EQUAL(TestDouble(-8.58810329425124), 0xc0212d1bdffef538);
    BOOST_CHECK_EQUAL(TestDouble(88.51393044338977), 0x405620e43c83b1c8);
    BOOST_CHECK_EQUAL(TestDouble(48.07224932612732), 0x4048093f77466ffc);
    BOOST_CHECK_EQUAL(TestDouble(9.867348871395659e+117), 0x586f4daeb2459b9f);
    BOOST_CHECK_EQUAL(TestDouble(-1.5166424385129721e+206), 0xeabe3bbc484bd458);
    BOOST_CHECK_EQUAL(TestDouble(-8.585156555624594e-275), 0x8707c76eee012429);
    BOOST_CHECK_EQUAL(TestDouble(2.2794371091628822e+113), 0x5777b2184458f4ee);
    BOOST_CHECK_EQUAL(TestDouble(-1.1290476594131867e+163), 0xe1c91893d3488bb0);
    BOOST_CHECK_EQUAL(TestDouble(9.143848423979275e-246), 0x0d0ff76e5f2620a3);
    BOOST_CHECK_EQUAL(TestDouble(-2.8366718125941117e+81), 0xd0d7ec7e754b394a);
    BOOST_CHECK_EQUAL(TestDouble(-1.2754409481684012e+229), 0xef80d32f8ec55342);
    BOOST_CHECK_EQUAL(TestDouble(6.000577060053642e-186), 0x197a1be7c8209b6a);
    BOOST_CHECK_EQUAL(TestDouble(2.0839423284378986e-302), 0x014c94f8689cb0a5);
    BOOST_CHECK_EQUAL(TestDouble(-1.422140051483753e+259), 0xf5bd99271d04bb35);
    BOOST_CHECK_EQUAL(TestDouble(-1.0593973991188853e+46), 0xc97db0cdb72d1046);
    BOOST_CHECK_EQUAL(TestDouble(2.62945125875249e+190), 0x67779b36366c993b);
    BOOST_CHECK_EQUAL(TestDouble(-2.920377657275094e+115), 0xd7e7b7b45908e23b);
    BOOST_CHECK_EQUAL(TestDouble(9.790289014855851e-118), 0x27a3c031cc428bcc);
    BOOST_CHECK_EQUAL(TestDouble(-4.629317182034961e-114), 0xa866ccf0b753705a);
    BOOST_CHECK_EQUAL(TestDouble(-1.7674605603846528e+279), 0xf9e8ed383ffc3e25);
    BOOST_CHECK_EQUAL(TestDouble(2.5308171727712605e+120), 0x58ef5cd55f0ec997);
    BOOST_CHECK_EQUAL(TestDouble(-1.05034156412799e+54), 0xcb25eea1b9350fa0);

    // Test extreme values
    BOOST_CHECK_EQUAL(TestDouble(std::numeric_limits<double>::min()), 0x10000000000000);
    BOOST_CHECK_EQUAL(TestDouble(-std::numeric_limits<double>::min()), 0x8010000000000000);
    BOOST_CHECK_EQUAL(TestDouble(std::numeric_limits<double>::max()), 0x7fefffffffffffff);
    BOOST_CHECK_EQUAL(TestDouble(-std::numeric_limits<double>::max()), 0xffefffffffffffff);
    BOOST_CHECK_EQUAL(TestDouble(std::numeric_limits<double>::lowest()), 0xffefffffffffffff);
    BOOST_CHECK_EQUAL(TestDouble(-std::numeric_limits<double>::lowest()), 0x7fefffffffffffff);
    BOOST_CHECK_EQUAL(TestDouble(std::numeric_limits<double>::denorm_min()), 0x1);
    BOOST_CHECK_EQUAL(TestDouble(-std::numeric_limits<double>::denorm_min()), 0x8000000000000001);
    // Note that all NaNs are encoded the same way.
    BOOST_CHECK_EQUAL(TestDouble(std::numeric_limits<double>::quiet_NaN()), 0x7ff8000000000000);
    BOOST_CHECK_EQUAL(TestDouble(-std::numeric_limits<double>::quiet_NaN()), 0x7ff8000000000000);
    BOOST_CHECK_EQUAL(TestDouble(std::numeric_limits<double>::signaling_NaN()), 0x7ff8000000000000);
    BOOST_CHECK_EQUAL(TestDouble(-std::numeric_limits<double>::signaling_NaN()), 0x7ff8000000000000);

    // Construct doubles to test from the encoding.
    static_assert(sizeof(double) == 8);
    static_assert(sizeof(uint64_t) == 8);
    for (int j = 0; j < 1000; ++j) {
        // Iterate over 9 specific bits exhaustively; the others are chosen randomly.
        // These specific bits are the sign bit, and the 2 top and bottom bits of
        // exponent and mantissa in the IEEE754 binary64 format.
        for (int x = 0; x < 512; ++x) {
            uint64_t v = m_rng.randbits(64);
            int x_pos = 0;
            for (int v_pos : {0, 1, 50, 51, 52, 53, 61, 62, 63}) {
                v &= ~(uint64_t{1} << v_pos);
                if ((x >> (x_pos++)) & 1) v |= (uint64_t{1} << v_pos);
            }
            double f;
            memcpy(&f, &v, 8);
            TestDouble(f);
        }
    }
}